

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O1

BYTE * R_GetColumn(FTexture *tex,int col)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  ulong uVar3;
  
  uVar3 = CONCAT44(in_register_00000034,col);
  if (col < 0) {
    uVar1 = tex->Width;
    if (1 << (tex->WidthBits & 0x1f) != (uint)uVar1) {
      uVar3 = (ulong)(col % (int)(uint)uVar1 + (uint)uVar1);
    }
  }
  iVar2 = (*tex->_vptr_FTexture[2])(tex,uVar3,0);
  return (BYTE *)CONCAT44(extraout_var,iVar2);
}

Assistant:

const BYTE *R_GetColumn (FTexture *tex, int col)
{
	int width;

	// If the texture's width isn't a power of 2, then we need to make it a
	// positive offset for proper clamping.
	if (col < 0 && (width = tex->GetWidth()) != (1 << tex->WidthBits))
	{
		col = width + (col % width);
	}
	return tex->GetColumn (col, NULL);
}